

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

uint64_t kfold_int64arith(jit_State *J,uint64_t k1,uint64_t k2,IROp op)

{
  byte bVar1;
  IROp op_local;
  uint64_t k2_local;
  uint64_t k1_local;
  jit_State *J_local;
  
  bVar1 = (byte)k2;
  k2_local = k1;
  switch(op) {
  case IR_BAND:
    k2_local = k2 & k1;
    break;
  case IR_BOR:
    k2_local = k2 | k1;
    break;
  case IR_BXOR:
    k2_local = k2 ^ k1;
    break;
  case IR_BSHL:
    k2_local = k1 << (bVar1 & 0x3f);
    break;
  case IR_BSHR:
    k2_local = k1 >> (bVar1 & 0x3f);
    break;
  case IR_BSAR:
    k2_local = (long)k1 >> (bVar1 & 0x3f);
    break;
  case IR_BROL:
    k2_local = k1 << (bVar1 & 0x3f) | k1 >> (-(bVar1 & 0x3f) & 0x3f);
    break;
  case IR_BROR:
    k2_local = k1 << (-(bVar1 & 0x3f) & 0x3f) | k1 >> (bVar1 & 0x3f);
    break;
  case IR_ADD:
    k2_local = k2 + k1;
    break;
  case IR_SUB:
    k2_local = k1 - k2;
    break;
  case IR_MUL:
    k2_local = k2 * k1;
  }
  return k2_local;
}

Assistant:

static uint64_t kfold_int64arith(jit_State *J, uint64_t k1, uint64_t k2,
				 IROp op)
{
  UNUSED(J);
#if LJ_HASFFI
  switch (op) {
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
  case IR_BSHL: k1 <<= (k2 & 63); break;
  case IR_BSHR: k1 >>= (k2 & 63); break;
  case IR_BSAR: k1 = (uint64_t)((int64_t)k1 >> (k2 & 63)); break;
  case IR_BROL: k1 = lj_rol(k1, (k2 & 63)); break;
  case IR_BROR: k1 = lj_ror(k1, (k2 & 63)); break;
  default: lj_assertJ(0, "bad IR op %d", op); break;
  }
#else
  UNUSED(k2); UNUSED(op);
  lj_assertJ(0, "FFI IR op without FFI");
#endif
  return k1;
}